

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

void __thiscall zmq::stream_engine_base_t::unplug(stream_engine_base_t *this)

{
  io_object_t *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (((*(byte *)&in_RDI[0x5f]._poller ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_plugged",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xc9);
    fflush(_stderr);
    zmq_abort((char *)0x2391ed);
  }
  *(undefined1 *)&in_RDI[0x5f]._poller = 0;
  if (((ulong)in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events & 1) != 0) {
    io_object_t::cancel_timer(in_RDI,in_stack_ffffffffffffffec);
    *(undefined1 *)&in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events = 0;
  }
  if (((ulong)in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events & 0x100) != 0) {
    io_object_t::cancel_timer(in_RDI,in_stack_ffffffffffffffec);
    *(undefined1 *)((long)&in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events + 1) = 0;
  }
  if (((ulong)in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events & 0x10000) != 0) {
    io_object_t::cancel_timer(in_RDI,in_stack_ffffffffffffffec);
    *(undefined1 *)((long)&in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events + 2) = 0;
  }
  if (((ulong)in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events & 0x1000000) != 0) {
    io_object_t::cancel_timer(in_RDI,in_stack_ffffffffffffffec);
    *(undefined1 *)((long)&in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events + 3) = 0;
  }
  if (((ulong)in_RDI[100].super_i_poll_events._vptr_i_poll_events & 1) == 0) {
    io_object_t::rm_fd(in_RDI,(handle_t)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  io_object_t::unplug(in_RDI);
  in_RDI[100]._poller = (poller_t *)0x0;
  return;
}

Assistant:

void zmq::stream_engine_base_t::unplug ()
{
    zmq_assert (_plugged);
    _plugged = false;

    //  Cancel all timers.
    if (_has_handshake_timer) {
        cancel_timer (handshake_timer_id);
        _has_handshake_timer = false;
    }

    if (_has_ttl_timer) {
        cancel_timer (heartbeat_ttl_timer_id);
        _has_ttl_timer = false;
    }

    if (_has_timeout_timer) {
        cancel_timer (heartbeat_timeout_timer_id);
        _has_timeout_timer = false;
    }

    if (_has_heartbeat_timer) {
        cancel_timer (heartbeat_ivl_timer_id);
        _has_heartbeat_timer = false;
    }
    //  Cancel all fd subscriptions.
    if (!_io_error)
        rm_fd (_handle);

    //  Disconnect from I/O threads poller object.
    io_object_t::unplug ();

    _session = NULL;
}